

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O2

void allocate(file *file,int allocate_idat)

{
  void *pvVar1;
  global *pgVar2;
  __mbstate_t _Var3;
  
  pvVar1 = file->alloc_ptr;
  if (allocate_idat == 0) {
    if (file->chunk != (chunk *)0x0) {
      __assert_fail("file->chunk == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                    ,0xdde,"void allocate(struct file *, int)");
    }
    clear((chunk *)((long)pvVar1 + 0x160),0x58);
    *(file **)((long)pvVar1 + 0x160) = file;
    *(global **)((long)pvVar1 + 0x168) = file->global;
    _Var3 = (file->data_pos).__state;
    *(__off_t *)((long)pvVar1 + 400) = (file->data_pos).__pos;
    *(__mbstate_t *)((long)pvVar1 + 0x198) = _Var3;
    *(undefined8 *)((long)pvVar1 + 0x1a0) = *(undefined8 *)&file->length;
    *(undefined4 *)((long)pvVar1 + 0x17c) = 0;
    *(undefined4 *)((long)pvVar1 + 0x18c) = 0;
    file->chunk = (chunk *)((long)pvVar1 + 0x160);
  }
  else {
    if (file->idat != (IDAT *)0x0) {
      __assert_fail("file->idat == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                    ,0xdd8,"void allocate(struct file *, int)");
    }
    if (file->chunk != (chunk *)0x0) {
      __assert_fail("file->chunk == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                    ,0x6fd,"void IDAT_init(struct IDAT *const, struct file *const)");
    }
    clear((IDAT *)((long)pvVar1 + 0x1b8),0x38);
    *(file **)((long)pvVar1 + 0x1b8) = file;
    pgVar2 = file->global;
    *(global **)((long)pvVar1 + 0x1c0) = pgVar2;
    (pgVar2->idat_cache).count = 0;
    *(IDAT_list **)((long)pvVar1 + 0x1d0) = &pgVar2->idat_cache;
    *(IDAT_list **)((long)pvVar1 + 0x1c8) = &pgVar2->idat_cache;
    (*file->alloc)(file,0);
    if (file->chunk == (chunk *)0x0) {
      __assert_fail("file->chunk != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                    ,0x70f,"void IDAT_init(struct IDAT *const, struct file *const)");
    }
    file->idat = (IDAT *)((long)pvVar1 + 0x1b8);
  }
  return;
}

Assistant:

static void
allocate(struct file *file, int allocate_idat)
{
   struct control *control = voidcast(struct control*, file->alloc_ptr);

   if (allocate_idat)
   {
      assert(file->idat == NULL);
      IDAT_init(&control->idat, file);
   }

   else /* chunk */
   {
      assert(file->chunk == NULL);
      chunk_init(&control->chunk, file);
   }
}